

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O3

dynamic_string * __thiscall crnlib::dynamic_string::left(dynamic_string *this,uint len)

{
  ushort uVar1;
  ulong uVar2;
  
  uVar1 = this->m_len;
  if (uVar1 == 0) {
    clear(this);
  }
  else {
    uVar2 = (ulong)(uint)uVar1;
    if (len < uVar1) {
      uVar2 = (ulong)len;
    }
    this->m_pStr[uVar2] = '\0';
    this->m_len = (uint16)uVar2;
  }
  return this;
}

Assistant:

dynamic_string& dynamic_string::left(uint len) {
  return substring(0, len);
}